

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STInteger.cpp
# Opt level: O2

Value __thiscall
jbcoin::STInteger<unsigned_short>::getJson(STInteger<unsigned_short> *this,int param_1)

{
  ushort uVar1;
  int iVar2;
  Item *pIVar3;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined4 in_register_00000034;
  long lVar4;
  Value VVar5;
  
  lVar4 = CONCAT44(in_register_00000034,param_1);
  iVar2 = **(int **)(lVar4 + 8);
  if (iVar2 == sfLedgerEntryType) {
    LedgerFormats::getInstance();
    pIVar3 = KnownFormats<jbcoin::LedgerEntryType>::findByType
                       (&LedgerFormats::getInstance::instance.
                         super_KnownFormats<jbcoin::LedgerEntryType>,(uint)*(ushort *)(lVar4 + 0x10)
                       );
    if (pIVar3 == (Item *)0x0) {
      iVar2 = **(int **)(lVar4 + 8);
      in_RDX = extraout_RDX;
      goto LAB_001d9a69;
    }
LAB_001d9a8c:
    Json::Value::Value((Value *)this,&pIVar3->m_name);
    in_RDX = extraout_RDX_01;
  }
  else {
LAB_001d9a69:
    if (iVar2 == sfTransactionType) {
      TxFormats::getInstance();
      pIVar3 = (Item *)KnownFormats<jbcoin::TxType>::findByType
                                 (&TxFormats::getInstance::instance.
                                   super_KnownFormats<jbcoin::TxType>,
                                  (uint)*(ushort *)(lVar4 + 0x10));
      in_RDX = extraout_RDX_00;
      if (pIVar3 != (Item *)0x0) goto LAB_001d9a8c;
    }
    uVar1 = *(ushort *)(lVar4 + 0x10);
    *(undefined1 *)&(this->super_STBase).fName = 1;
    *(uint *)&(this->super_STBase)._vptr_STBase = (uint)uVar1;
  }
  VVar5._8_8_ = in_RDX;
  VVar5.value_.map_ = (ObjectValues *)this;
  return VVar5;
}

Assistant:

Json::Value
STUInt16::getJson (int) const
{
    if (getFName () == sfLedgerEntryType)
    {
        auto item = LedgerFormats::getInstance ().findByType (
            static_cast <LedgerEntryType> (value_));

        if (item != nullptr)
            return item->getName ();
    }

    if (getFName () == sfTransactionType)
    {
        auto item = TxFormats::getInstance().findByType (
            static_cast <TxType> (value_));

        if (item != nullptr)
            return item->getName ();
    }

    return value_;
}